

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

RegOpnd * __thiscall
Lowerer::GenerateCachedTypeCheck
          (Lowerer *this,Instr *instrChk,PropertySymOpnd *propertySymOpnd,
          LabelInstr *labelObjCheckFailed,LabelInstr *labelTypeCheckFailed,
          LabelInstr *labelSecondChance)

{
  Func *func;
  code *pcVar1;
  JITTypeHolderBase<void> type;
  bool bVar2;
  BYTE scale;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  RegOpnd *pRVar8;
  IndirOpnd *src;
  JitEquivalentTypeGuard *typeCheckGuard;
  RegOpnd *indexOpnd;
  RegOpnd *baseOpnd;
  JitPolyEquivalentTypeGuard *pJVar9;
  AddrOpnd *pAVar10;
  JITType *this_00;
  intptr_t address;
  JITTimeFunctionBody *pJVar11;
  FunctionJITTimeInfo *this_01;
  void *pvVar12;
  LabelInstr *target;
  BranchInstr *pBVar13;
  LabelInstr *target_00;
  PropertySym *pPVar14;
  HelperCallOpnd *src1Opnd;
  Instr *instr;
  char16_t *pcVar15;
  JITTypeHolder JVar16;
  Lowerer *pLVar17;
  JITTypeHolder target_01;
  LowererMD *this_02;
  JnHelperMethod fnHelper;
  nullptr_t local_4a8;
  WCHAR prefixValue [512];
  nullptr_t local_a0;
  LabelInstr *local_98;
  char16 *local_90;
  JITTypeHolderBase<void> local_88;
  JITTypeHolder directCheckType;
  IndirOpnd *local_60;
  JITTypeHolderBase<void> local_48;
  JITTypeHolder monoType;
  
  directCheckType.t = (Type)labelTypeCheckFailed;
  bVar2 = IR::PropertySymOpnd::MayNeedTypeCheckProtection(propertySymOpnd);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1d96,"(propertySymOpnd->MayNeedTypeCheckProtection())",
                       "propertySymOpnd->MayNeedTypeCheckProtection()");
    if (!bVar2) goto LAB_0056892b;
    *puVar7 = 0;
  }
  func = instrChk->m_func;
  local_98 = labelSecondChance;
  pRVar8 = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,func);
  IR::Opnd::SetValueType
            (&pRVar8->super_Opnd,
             (ValueType)
             SUB42(*(undefined4 *)&(propertySymOpnd->super_SymOpnd).propertyOwnerValueType,0));
  bVar2 = IR::Opnd::IsNotTaggedValue(&pRVar8->super_Opnd);
  if (!bVar2) {
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,&pRVar8->super_Opnd,instrChk,labelObjCheckFailed,false);
  }
  monoType.t = (Type)IR::RegOpnd::New(TyInt64,func);
  bVar2 = StackSym::IsConst(pRVar8->m_sym);
  if (((!bVar2) || (bVar2 = StackSym::IsIntConst(pRVar8->m_sym), bVar2)) ||
     (bVar2 = StackSym::IsFloatConst(pRVar8->m_sym), bVar2)) {
    src = IR::IndirOpnd::New(pRVar8,8,TyInt64,func,false);
  }
  else {
    pvVar12 = StackSym::GetConstAddress(pRVar8->m_sym,false);
    src = (IndirOpnd *)
          IR::MemRefOpnd::New((void *)((long)pvVar12 + 8),TyInt64,func,
                              AddrOpndKindDynamicObjectTypeRef);
  }
  InsertMove((Opnd *)monoType.t,&src->super_Opnd,instrChk,true);
  bVar2 = IR::Instr::HasEquivalentTypeCheckBailOut(instrChk);
  if (((bVar2) &&
      (((char)(propertySymOpnd->field_12).field_0.field_5.typeCheckSeqFlags < '\0' ||
       ((PropertySymOpnd *)instrChk->m_dst == propertySymOpnd)))) ||
     ((bVar2 = IR::PropertySymOpnd::HasEquivalentTypeSet(propertySymOpnd), bVar2 &&
      (((bVar2 = IR::PropertySymOpnd::HasFinalType(propertySymOpnd), !bVar2 ||
        (bVar2 = IR::PropertySymOpnd::HasInitialType(propertySymOpnd), !bVar2)) &&
       ((bVar2 = IR::PropertySymOpnd::MustDoMonoCheck(propertySymOpnd), !bVar2 &&
        ((bVar2 = IR::PropertySymOpnd::IsPoly(propertySymOpnd), bVar2 ||
         (bVar2 = IR::Instr::HasTypeCheckBailOut(instrChk), bVar2)))))))))) {
    indexOpnd = (RegOpnd *)0x0;
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_48,(JITType *)0x0);
    typeCheckGuard = CreateEquivalentTypeGuardAndLinkToGuardedProperties(this,propertySymOpnd);
    bVar2 = true;
    if ((typeCheckGuard->super_JitIndexedPropertyGuard).super_PropertyGuard.isPoly == true) {
      bVar3 = IR::PropertySymOpnd::ShouldUsePolyEquivTypeGuard(propertySymOpnd,this->m_func);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1dc4,"(propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func))",
                           "propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func)");
        if (!bVar3) goto LAB_0056892b;
        *puVar7 = 0;
      }
      indexOpnd = GeneratePolymorphicTypeIndex
                            (this,(RegOpnd *)monoType.t,(PropertyGuard *)typeCheckGuard,instrChk);
    }
  }
  else {
    bVar2 = IR::Instr::HasEquivalentTypeCheckBailOut(instrChk);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1db8,"(doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut())",
                         "doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut()");
      if (!bVar2) goto LAB_0056892b;
      *puVar7 = 0;
    }
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_48,(JITType *)0x0);
    bVar2 = IR::PropertySymOpnd::MustDoMonoCheck(propertySymOpnd);
    if (bVar2) {
      local_48.t = (propertySymOpnd->monoGuardType).t;
    }
    else {
      local_48.t = (Type)IR::PropertySymOpnd::GetType(propertySymOpnd);
    }
    typeCheckGuard =
         (JitEquivalentTypeGuard *)
         CreateTypePropertyGuardForGuardedProperties(this,(JITTypeHolder)local_48.t,propertySymOpnd)
    ;
    bVar2 = false;
    indexOpnd = (RegOpnd *)0x0;
  }
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_88,(JITType *)0x0);
  if (typeCheckGuard == (JitEquivalentTypeGuard *)0x0) {
    local_4a8 = (nullptr_t)0x0;
    bVar3 = JITTypeHolderBase<void>::operator!=(&local_48,&local_4a8);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1dd3,"(monoType != nullptr)","monoType != nullptr");
      if (!bVar3) goto LAB_0056892b;
      *puVar7 = 0;
    }
    this_00 = JITTypeHolderBase<void>::operator->(&local_48);
    address = JITType::GetAddr(this_00);
    local_60 = (IndirOpnd *)IR::AddrOpnd::New(address,AddrOpndKindDynamicType,func,true,(Var)0x0);
    local_88.t = local_48.t;
  }
  else if (indexOpnd == (RegOpnd *)0x0) {
    local_60 = (IndirOpnd *)
               IR::MemRefOpnd::New(typeCheckGuard,TyUint64,func,AddrOpndKindDynamicGuardValueRef);
  }
  else {
    baseOpnd = IR::RegOpnd::New(TyUint64,func);
    pJVar9 = Js::PropertyGuard::AsPolyTypeCheckGuard((PropertyGuard *)typeCheckGuard);
    pAVar10 = IR::AddrOpnd::New(pJVar9->polyValues,AddrOpndKindDynamicTypeCheckGuard,func,true,
                                (Var)0x0);
    InsertMove(&baseOpnd->super_Opnd,&pAVar10->super_Opnd,instrChk,true);
    scale = LowererMDArch::GetDefaultIndirScale();
    local_60 = IR::IndirOpnd::New(baseOpnd,indexOpnd,scale,TyUint64,func);
  }
  uVar4 = Func::GetSourceContextId(this->m_func);
  uVar5 = Func::GetLocalFunctionId(this->m_func);
  pLVar17 = (Lowerer *)&DAT_01453738;
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar4,uVar5);
  if ((bVar3) && (DAT_0145948a == '\x01')) {
    uVar4 = Func::GetSourceContextId(this->m_func);
    uVar5 = Func::GetLocalFunctionId(this->m_func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar4,uVar5);
    if (bVar3) {
      pJVar11 = Func::GetJITFunctionBody(this->m_func);
      local_90 = JITTimeFunctionBody::GetDisplayName(pJVar11);
      pJVar11 = Func::GetJITFunctionBody(this->m_func);
      uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
      this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
      pJVar11 = Func::GetJITFunctionBody(this->m_func);
      uVar6 = JITTimeFunctionBody::GetFunctionNumber(pJVar11);
      swprintf_s<512ul>((WCHAR (*) [512])&local_4a8,L"%s (#%d.%u, #%u)",local_90,(ulong)uVar4,
                        (ulong)uVar5,(ulong)uVar6);
      local_a0 = (nullptr_t)0x0;
      bVar3 = JITTypeHolderBase<void>::operator!=(&local_88,&local_a0);
      if (bVar3) {
        pcVar15 = L"direct";
      }
      else {
        bVar3 = IR::PropertySymOpnd::IsPoly(propertySymOpnd);
        pcVar15 = L"indirect";
        if (bVar3) {
          pcVar15 = L"equivalent";
        }
      }
      Output::TraceWithPrefix
                (ObjTypeSpecPhase,(char16 *)&local_4a8,L"Emitted %s type check ",pcVar15);
    }
    if (propertySymOpnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pLVar17 = (Lowerer *)0xdfdeb2;
      Output::Print(L"\n");
    }
    else {
      Output::Print(L" guarding operations:\n    ");
      pLVar17 = (Lowerer *)propertySymOpnd->guardedPropOps;
      BVSparse<Memory::JitArenaAllocator>::Dump((BVSparse<Memory::JitArenaAllocator> *)pLVar17);
    }
    Output::Flush();
  }
  JVar16.t = monoType.t;
  if (bVar2) {
    pLVar17 = (Lowerer *)0x176;
    target = IR::LabelInstr::New(Label,func,true);
    pBVar13 = InsertCompareBranch(pLVar17,(Opnd *)monoType.t,&local_60->super_Opnd,BrNeq_A,target,
                                  instrChk,false);
    LowererMD::InsertObjectPoison(&pRVar8->super_Opnd,pBVar13,instrChk,false);
    target_00 = IR::LabelInstr::New(Label,func,false);
    InsertBranch(Br,target_00,instrChk);
    IR::Instr::InsertBefore(instrChk,&target->super_Instr);
    pAVar10 = IR::AddrOpnd::New(typeCheckGuard,AddrOpndKindDynamicTypeCheckGuard,func,true,(Var)0x0)
    ;
    bVar2 = IR::PropertySymOpnd::HasFixedValue(propertySymOpnd);
    if (indexOpnd == (RegOpnd *)0x0) {
      fnHelper = bVar2 + HelperCheckIfTypeIsEquivalent;
    }
    else {
      fnHelper = bVar2 + HelperCheckIfPolyTypeIsEquivalent;
      LowererMD::LoadHelperArgument(&this->m_lowererMD,instrChk,&indexOpnd->super_Opnd);
    }
    this_02 = &this->m_lowererMD;
    LowererMD::LoadHelperArgument(this_02,instrChk,&pAVar10->super_Opnd);
    LowererMD::LoadHelperArgument(this_02,instrChk,(Opnd *)monoType.t);
    pRVar8 = IR::RegOpnd::New(TyUint8,func);
    src1Opnd = IR::HelperCallOpnd::New(fnHelper,func);
    instr = IR::Instr::New(Call,&pRVar8->super_Opnd,&src1Opnd->super_Opnd,func);
    IR::Instr::InsertBefore(instrChk,instr);
    LowererMD::LowerCall(this_02,instr,0);
    InsertTestBranch(&pRVar8->super_Opnd,&pRVar8->super_Opnd,BrEq_A,(LabelInstr *)directCheckType.t,
                     instrChk);
    JVar16 = monoType;
    IR::Instr::InsertBefore(instrChk,&target_00->super_Instr);
  }
  else {
    target_01.t = directCheckType.t;
    if (local_98 != (LabelInstr *)0x0) {
      target_01.t = (Type)local_98;
    }
    pBVar13 = InsertCompareBranch(pLVar17,(Opnd *)monoType.t,&local_60->super_Opnd,BrNeq_A,
                                  (LabelInstr *)target_01.t,instrChk,false);
    LowererMD::InsertObjectPoison(&pRVar8->super_Opnd,pBVar13,instrChk,false);
    local_4a8 = (nullptr_t)0x0;
    bVar2 = JITTypeHolderBase<void>::operator!=(&local_48,&local_4a8);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1e51,"(monoType != nullptr)","monoType != nullptr");
      if (!bVar2) {
LAB_0056892b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    type.t = (Type)local_48;
    pPVar14 = Sym::AsPropertySym((propertySymOpnd->super_SymOpnd).m_sym);
    PinTypeRef(this,(JITTypeHolder)type.t,type.t,instrChk,pPVar14->m_propertyId);
  }
  return (RegOpnd *)JVar16.t;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateCachedTypeCheck(IR::Instr *instrChk, IR::PropertySymOpnd *propertySymOpnd, IR::LabelInstr* labelObjCheckFailed, IR::LabelInstr *labelTypeCheckFailed, IR::LabelInstr *labelSecondChance)
{
    Assert(propertySymOpnd->MayNeedTypeCheckProtection());

    Func* func = instrChk->m_func;
    IR::RegOpnd *regOpnd = propertySymOpnd->CreatePropertyOwnerOpnd(func);
    regOpnd->SetValueType(propertySymOpnd->GetPropertyOwnerValueType());

    if (!regOpnd->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(regOpnd, instrChk, labelObjCheckFailed);
    }

    // Load the current object type into typeOpnd
    IR::RegOpnd* typeOpnd = IR::RegOpnd::New(TyMachReg, func);
    IR::Opnd *sourceType;
    if (regOpnd->m_sym->IsConst() && !regOpnd->m_sym->IsIntConst() && !regOpnd->m_sym->IsFloatConst())
    {
        sourceType = IR::MemRefOpnd::New((BYTE*)regOpnd->m_sym->GetConstAddress() +
            Js::RecyclableObject::GetOffsetOfType(), TyMachReg, func, IR::AddrOpndKindDynamicObjectTypeRef);
    }
    else
    {
        sourceType = IR::IndirOpnd::New(regOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, func);
    }
    InsertMove(typeOpnd, sourceType, instrChk);

    // Note: don't attempt equivalent type check if we're doing a final type optimization or if we have a monomorphic
    // cache and no type check bailout. In the latter case, we can wind up doing expensive failed equivalence checks
    // repeatedly and never rejit.
    bool doEquivTypeCheck =
        (instrChk->HasEquivalentTypeCheckBailOut() && (propertySymOpnd->TypeCheckRequired() || propertySymOpnd == instrChk->GetDst())) ||
        (propertySymOpnd->HasEquivalentTypeSet() &&
         !(propertySymOpnd->HasFinalType() && propertySymOpnd->HasInitialType()) &&
         !propertySymOpnd->MustDoMonoCheck() &&
         (propertySymOpnd->IsPoly() || instrChk->HasTypeCheckBailOut()));
    Assert(doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut());

    // Create and initialize the property guard if required. Note that for non-shared monomorphic checks we can refer
    // directly to the (pinned) type and not use a guard.
    Js::PropertyGuard * typeCheckGuard;
    IR::RegOpnd * polyIndexOpnd = nullptr;
    JITTypeHolder monoType = nullptr;
    if (doEquivTypeCheck)
    {
        typeCheckGuard = CreateEquivalentTypeGuardAndLinkToGuardedProperties(propertySymOpnd);
        if (typeCheckGuard->IsPoly())
        {
            Assert(propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func));
            polyIndexOpnd = this->GeneratePolymorphicTypeIndex(typeOpnd, typeCheckGuard, instrChk);
        }
    }
    else
    {
        monoType = propertySymOpnd->MustDoMonoCheck() ? propertySymOpnd->GetMonoGuardType() : propertySymOpnd->GetType();
        typeCheckGuard = this->CreateTypePropertyGuardForGuardedProperties(monoType, propertySymOpnd);
    }

    // Create the opnd we will check against the current type.
    IR::Opnd *expectedTypeOpnd;
    JITTypeHolder directCheckType = nullptr;
    if (typeCheckGuard == nullptr)
    {
        Assert(monoType != nullptr);
        expectedTypeOpnd = IR::AddrOpnd::New(monoType->GetAddr(), IR::AddrOpndKindDynamicType, func, true);
        directCheckType = monoType;
    }
    else
    {
        Assert(Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr]));

        if (this->m_func->IsOOPJIT())
        {
            if (polyIndexOpnd != nullptr)
            {
                IR::RegOpnd * baseOpnd = IR::RegOpnd::New(TyMachPtr, func);
                this->GenerateLeaOfOOPData(baseOpnd, typeCheckGuard, Js::JitPolyEquivalentTypeGuard::GetOffsetOfPolyValues(), instrChk);
                expectedTypeOpnd = IR::IndirOpnd::New(baseOpnd, polyIndexOpnd, m_lowererMD.GetDefaultIndirScale(), TyMachPtr, func);
            }
            else
            {
                expectedTypeOpnd = this->GenerateIndirOfOOPData(typeCheckGuard, 0, instrChk);
            }
            this->addToLiveOnBackEdgeSyms->Set(func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            if (polyIndexOpnd != nullptr)
            {
                IR::RegOpnd * baseOpnd = IR::RegOpnd::New(TyMachPtr, func);
                InsertMove(baseOpnd, IR::AddrOpnd::New((Js::Var)typeCheckGuard->AsPolyTypeCheckGuard()->GetAddressOfPolyValues(), IR::AddrOpndKindDynamicTypeCheckGuard, func, true), instrChk);
                expectedTypeOpnd = IR::IndirOpnd::New(baseOpnd, polyIndexOpnd, m_lowererMD.GetDefaultIndirScale(), TyMachPtr, func);
            }
            else
            {
                expectedTypeOpnd = IR::MemRefOpnd::New((void*)(typeCheckGuard->GetAddressOfValue()), TyMachPtr, func, IR::AddrOpndKindDynamicGuardValueRef);
            }
        }
    }

    if (PHASE_VERBOSE_TRACE(Js::ObjTypeSpecPhase, this->m_func))
    {
        OUTPUT_VERBOSE_TRACE_FUNC(Js::ObjTypeSpecPhase, this->m_func, _u("Emitted %s type check "),
            directCheckType != nullptr ? _u("direct") : propertySymOpnd->IsPoly() ? _u("equivalent") : _u("indirect"));
#if DBG
        if (propertySymOpnd->GetGuardedPropOps() != nullptr)
        {
            Output::Print(_u(" guarding operations:\n    "));
            propertySymOpnd->GetGuardedPropOps()->Dump();
        }
        else
        {
            Output::Print(_u("\n"));
        }
#else
        Output::Print(_u("\n"));
#endif
        Output::Flush();
    }

    if (doEquivTypeCheck)
    {
        // TODO (ObjTypeSpec): For isolated equivalent type checks it would be good to emit a check if the cache is still valid, and
        // if not go straight to live polymorphic cache.  This way we wouldn't have to bail out and re-JIT, and also wouldn't continue
        // to try the equivalent type cache, miss it and do the slow comparison. This may be as easy as sticking a null on the main
        // type in the equivalent type cache.
        IR::LabelInstr* labelCheckEquivalentType = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        IR::BranchInstr* branchInstr = InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelCheckEquivalentType, instrChk);

        InsertObjectPoison(regOpnd, branchInstr, instrChk, false);

        IR::LabelInstr *labelTypeCheckSucceeded = IR::LabelInstr::New(Js::OpCode::Label, func, false);
        InsertBranch(Js::OpCode::Br, labelTypeCheckSucceeded, instrChk);

        instrChk->InsertBefore(labelCheckEquivalentType);

        IR::Opnd* typeCheckGuardOpnd = nullptr;
        if (this->m_func->IsOOPJIT())
        {
            typeCheckGuardOpnd = IR::RegOpnd::New(TyMachPtr, func);
            this->GenerateLeaOfOOPData(typeCheckGuardOpnd->AsRegOpnd(), typeCheckGuard, 0, instrChk);
            this->addToLiveOnBackEdgeSyms->Set(func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            typeCheckGuardOpnd = IR::AddrOpnd::New((Js::Var)typeCheckGuard, IR::AddrOpndKindDynamicTypeCheckGuard, func, true);
        }

        IR::JnHelperMethod helperMethod;
        if (polyIndexOpnd != nullptr)
        {
            helperMethod = propertySymOpnd->HasFixedValue() ? IR::HelperCheckIfPolyTypeIsEquivalentForFixedField : IR::HelperCheckIfPolyTypeIsEquivalent;

            this->m_lowererMD.LoadHelperArgument(instrChk, polyIndexOpnd);
        }
        else
        {
            helperMethod = propertySymOpnd->HasFixedValue() ? IR::HelperCheckIfTypeIsEquivalentForFixedField : IR::HelperCheckIfTypeIsEquivalent;
        }
        this->m_lowererMD.LoadHelperArgument(instrChk, typeCheckGuardOpnd);
        this->m_lowererMD.LoadHelperArgument(instrChk, typeOpnd);

        IR::RegOpnd* equivalentTypeCheckResultOpnd = IR::RegOpnd::New(TyUint8, func);
        IR::HelperCallOpnd* equivalentTypeCheckHelperCallOpnd = IR::HelperCallOpnd::New(helperMethod, func);
        IR::Instr* equivalentTypeCheckCallInstr = IR::Instr::New(Js::OpCode::Call, equivalentTypeCheckResultOpnd, equivalentTypeCheckHelperCallOpnd, func);
        instrChk->InsertBefore(equivalentTypeCheckCallInstr);
        this->m_lowererMD.LowerCall(equivalentTypeCheckCallInstr, 0);

        InsertTestBranch(equivalentTypeCheckResultOpnd, equivalentTypeCheckResultOpnd, Js::OpCode::BrEq_A, labelTypeCheckFailed, instrChk);

        // TODO (ObjTypeSpec): Consider emitting a shared bailout to which a specific bailout kind is written at runtime. This would allow us to distinguish
        // between non-equivalent type and other cases, such as invalidated guard (due to fixed field overwrite, perhaps) or too much thrashing on the
        // equivalent type cache. We could determine bailout kind based on the value returned by the helper. In the case of cache thrashing we could just
        // turn off the whole optimization for a given function.

        instrChk->InsertBefore(labelTypeCheckSucceeded);
    }
    else
    {
        IR::BranchInstr* branchInstr = InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelSecondChance != nullptr ? labelSecondChance : labelTypeCheckFailed, instrChk);
        InsertObjectPoison(regOpnd, branchInstr, instrChk, false);
    }

    // Don't pin the type for polymorphic operations. The code can successfully execute even if this type is no longer referenced by any objects,
    // as long as there are other objects with types equivalent on the properties referenced by this code. The type is kept alive until entry point
    // installation by the JIT transfer data, and after that by the equivalent type cache, so it will stay alive unless or until it gets evicted
    // from the cache.
    if (!doEquivTypeCheck)
    {
        Assert(monoType != nullptr);
        PinTypeRef(monoType, monoType.t, instrChk, propertySymOpnd->m_sym->AsPropertySym()->m_propertyId);
    }

    return typeOpnd;
}